

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

value_type * __thiscall
wasm::Random::
pick<std::vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
          (Random *this,
          vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          *vec)

{
  pointer ppVar1;
  pointer ppVar2;
  uint32_t uVar3;
  
  ppVar1 = (vec->
           super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (vec->
           super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)ppVar2 - (long)ppVar1) >> 4));
    return (vec->
           super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<std::pair<wasm::HeapType, unsigned int>>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }